

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shapes.cc
# Opt level: O0

void __thiscall p2t::Triangle::Legalize(Triangle *this,Point *opoint,Point *npoint)

{
  Point *npoint_local;
  Point *opoint_local;
  Triangle *this_local;
  
  if (opoint == this->points_[0]) {
    this->points_[1] = this->points_[0];
    this->points_[0] = this->points_[2];
    this->points_[2] = npoint;
  }
  else if (opoint == this->points_[1]) {
    this->points_[2] = this->points_[1];
    this->points_[1] = this->points_[0];
    this->points_[0] = npoint;
  }
  else {
    if (opoint != this->points_[2]) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/contrib/poly2tri/poly2tri/common/shapes.cc"
                    ,0x95,"void p2t::Triangle::Legalize(Point &, Point &)");
    }
    this->points_[0] = this->points_[2];
    this->points_[2] = this->points_[1];
    this->points_[1] = npoint;
  }
  return;
}

Assistant:

void Triangle::Legalize(Point& opoint, Point& npoint)
{
  if (&opoint == points_[0]) {
    points_[1] = points_[0];
    points_[0] = points_[2];
    points_[2] = &npoint;
  } else if (&opoint == points_[1]) {
    points_[2] = points_[1];
    points_[1] = points_[0];
    points_[0] = &npoint;
  } else if (&opoint == points_[2]) {
    points_[0] = points_[2];
    points_[2] = points_[1];
    points_[1] = &npoint;
  } else {
    assert(0);
  }
}